

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UBool __thiscall icu_63::MessagePattern::isChoice(MessagePattern *this,int32_t index)

{
  char16_t cVar1;
  bool local_22;
  bool local_21;
  UChar c;
  int32_t index_local;
  MessagePattern *this_local;
  
  cVar1 = UnicodeString::charAt(&this->msg,index);
  if ((cVar1 == L'c') || (local_21 = false, cVar1 == L'C')) {
    cVar1 = UnicodeString::charAt(&this->msg,index + 1);
    if ((cVar1 == L'h') || (local_21 = false, cVar1 == L'H')) {
      cVar1 = UnicodeString::charAt(&this->msg,index + 2);
      if ((cVar1 == L'o') || (local_21 = false, cVar1 == L'O')) {
        cVar1 = UnicodeString::charAt(&this->msg,index + 3);
        if ((cVar1 == L'i') || (local_21 = false, cVar1 == L'I')) {
          cVar1 = UnicodeString::charAt(&this->msg,index + 4);
          if ((cVar1 == L'c') || (local_21 = false, cVar1 == L'C')) {
            cVar1 = UnicodeString::charAt(&this->msg,index + 5);
            local_22 = cVar1 == L'e' || cVar1 == L'E';
            local_21 = local_22;
          }
        }
      }
    }
  }
  return local_21;
}

Assistant:

UBool
MessagePattern::isChoice(int32_t index) {
    UChar c;
    return
        ((c=msg.charAt(index++))==u_c || c==u_C) &&
        ((c=msg.charAt(index++))==u_h || c==u_H) &&
        ((c=msg.charAt(index++))==u_o || c==u_O) &&
        ((c=msg.charAt(index++))==u_i || c==u_I) &&
        ((c=msg.charAt(index++))==u_c || c==u_C) &&
        ((c=msg.charAt(index))==u_e || c==u_E);
}